

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_crypt.cc
# Opt level: O0

int RSA_padding_check_PKCS1_OAEP_mgf1
              (uint8_t *out,size_t *out_len,size_t max_out,uint8_t *from,size_t from_len,
              uint8_t *param,size_t param_len,EVP_MD *md,EVP_MD *mgf1md)

{
  int iVar1;
  undefined4 extraout_var;
  size_t size;
  crypto_word_t cVar2;
  crypto_word_t cVar3;
  ulong n;
  size_t mlen;
  crypto_word_t equals0;
  crypto_word_t equals1;
  size_t i_2;
  size_t one_index;
  crypto_word_t looking_for_one_byte;
  crypto_word_t bad;
  uint8_t phash [64];
  size_t i_1;
  size_t i;
  uint8_t seed [64];
  uint8_t *maskeddb;
  uint8_t *maskedseed;
  size_t dblen;
  size_t mdlen;
  uint8_t *db;
  uint8_t *param_local;
  size_t from_len_local;
  uint8_t *from_local;
  size_t max_out_local;
  size_t *out_len_local;
  uint8_t *out_local;
  
  mdlen = 0;
  if (md == (EVP_MD *)0x0) {
    md = (EVP_MD *)EVP_sha1();
  }
  if (mgf1md == (EVP_MD *)0x0) {
    mgf1md = md;
  }
  iVar1 = EVP_MD_size((EVP_MD *)md);
  equals1 = CONCAT44(extraout_var,iVar1);
  if (equals1 * 2 + 2 <= from_len) {
    size = (from_len - equals1) - 1;
    mdlen = (size_t)OPENSSL_malloc(size);
    if ((uchar *)mdlen == (uchar *)0x0) goto LAB_0022e022;
    seed._56_8_ = from + equals1 + 1;
    iVar1 = PKCS1_MGF1((uchar *)&i,equals1,(uchar *)seed._56_8_,size,(EVP_MD *)mgf1md);
    if (iVar1 == 0) goto LAB_0022e022;
    for (i_1 = 0; i_1 < equals1; i_1 = i_1 + 1) {
      seed[i_1 - 8] = seed[i_1 - 8] ^ from[i_1 + 1];
    }
    iVar1 = PKCS1_MGF1((uchar *)mdlen,size,(uchar *)&i,equals1,(EVP_MD *)mgf1md);
    if (iVar1 == 0) goto LAB_0022e022;
    phash[0x38] = '\0';
    phash[0x39] = '\0';
    phash[0x3a] = '\0';
    phash[0x3b] = '\0';
    phash[0x3c] = '\0';
    phash[0x3d] = '\0';
    phash[0x3e] = '\0';
    phash[0x3f] = '\0';
    for (; (ulong)phash._56_8_ < size; phash._56_8_ = phash._56_8_ + 1) {
      *(byte *)(mdlen + phash._56_8_) =
           *(byte *)(mdlen + phash._56_8_) ^ *(byte *)(seed._56_8_ + phash._56_8_);
    }
    iVar1 = EVP_Digest(param,param_len,(uchar *)&bad,(uint *)0x0,(EVP_MD *)md,(ENGINE *)0x0);
    if (iVar1 == 0) goto LAB_0022e022;
    iVar1 = CRYPTO_memcmp((void *)mdlen,&bad,equals1);
    cVar2 = constant_time_is_zero_w((long)iVar1);
    cVar3 = constant_time_is_zero_w((ulong)*from);
    looking_for_one_byte = cVar3 ^ 0xffffffffffffffff | cVar2 ^ 0xffffffffffffffff;
    one_index = 0xffffffffffffffff;
    i_2 = 0;
    for (; equals1 < size; equals1 = equals1 + 1) {
      cVar2 = constant_time_eq_w((ulong)*(byte *)(mdlen + equals1),1);
      cVar3 = constant_time_eq_w((ulong)*(byte *)(mdlen + equals1),0);
      i_2 = constant_time_select_w(one_index & cVar2,equals1,i_2);
      one_index = constant_time_select_w(cVar2,0,one_index);
      looking_for_one_byte = one_index & (cVar3 ^ 0xffffffffffffffff) | looking_for_one_byte;
    }
    cVar2 = constant_time_declassify_w(one_index | looking_for_one_byte);
    if (cVar2 == 0) {
      cVar2 = constant_time_declassify_w(i_2);
      n = size - (cVar2 + 1);
      if (n <= max_out) {
        OPENSSL_memcpy(out,(uchar *)(mdlen + cVar2 + 1),n);
        *out_len = n;
        OPENSSL_free((void *)mdlen);
        return 1;
      }
      ERR_put_error(4,0,0x71,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                    ,0xc9);
      goto LAB_0022e022;
    }
  }
  ERR_put_error(4,0,0x85,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_crypt.cc"
                ,0xd6);
LAB_0022e022:
  OPENSSL_free((void *)mdlen);
  return 0;
}

Assistant:

int RSA_padding_check_PKCS1_OAEP_mgf1(uint8_t *out, size_t *out_len,
                                      size_t max_out, const uint8_t *from,
                                      size_t from_len, const uint8_t *param,
                                      size_t param_len, const EVP_MD *md,
                                      const EVP_MD *mgf1md) {
  uint8_t *db = NULL;

  {
    if (md == NULL) {
      md = EVP_sha1();
    }
    if (mgf1md == NULL) {
      mgf1md = md;
    }

    size_t mdlen = EVP_MD_size(md);

    // The encoded message is one byte smaller than the modulus to ensure that
    // it doesn't end up greater than the modulus. Thus there's an extra "+1"
    // here compared to https://tools.ietf.org/html/rfc2437#section-9.1.1.2.
    if (from_len < 1 + 2 * mdlen + 1) {
      // 'from_len' is the length of the modulus, i.e. does not depend on the
      // particular ciphertext.
      goto decoding_err;
    }

    size_t dblen = from_len - mdlen - 1;
    db = reinterpret_cast<uint8_t *>(OPENSSL_malloc(dblen));
    if (db == NULL) {
      goto err;
    }

    const uint8_t *maskedseed = from + 1;
    const uint8_t *maskeddb = from + 1 + mdlen;

    uint8_t seed[EVP_MAX_MD_SIZE];
    if (!PKCS1_MGF1(seed, mdlen, maskeddb, dblen, mgf1md)) {
      goto err;
    }
    for (size_t i = 0; i < mdlen; i++) {
      seed[i] ^= maskedseed[i];
    }

    if (!PKCS1_MGF1(db, dblen, seed, mdlen, mgf1md)) {
      goto err;
    }
    for (size_t i = 0; i < dblen; i++) {
      db[i] ^= maskeddb[i];
    }

    uint8_t phash[EVP_MAX_MD_SIZE];
    if (!EVP_Digest(param, param_len, phash, NULL, md, NULL)) {
      goto err;
    }

    crypto_word_t bad =
        ~constant_time_is_zero_w(CRYPTO_memcmp(db, phash, mdlen));
    bad |= ~constant_time_is_zero_w(from[0]);

    crypto_word_t looking_for_one_byte = CONSTTIME_TRUE_W;
    size_t one_index = 0;
    for (size_t i = mdlen; i < dblen; i++) {
      crypto_word_t equals1 = constant_time_eq_w(db[i], 1);
      crypto_word_t equals0 = constant_time_eq_w(db[i], 0);
      one_index =
          constant_time_select_w(looking_for_one_byte & equals1, i, one_index);
      looking_for_one_byte =
          constant_time_select_w(equals1, 0, looking_for_one_byte);
      bad |= looking_for_one_byte & ~equals0;
    }

    bad |= looking_for_one_byte;

    // Whether the overall padding was valid or not in OAEP is public.
    if (constant_time_declassify_w(bad)) {
      goto decoding_err;
    }

    // Once the padding is known to be valid, the output length is also public.
    static_assert(sizeof(size_t) <= sizeof(crypto_word_t),
                  "size_t does not fit in crypto_word_t");
    one_index = constant_time_declassify_w(one_index);

    one_index++;
    size_t mlen = dblen - one_index;
    if (max_out < mlen) {
      OPENSSL_PUT_ERROR(RSA, RSA_R_DATA_TOO_LARGE);
      goto err;
    }

    OPENSSL_memcpy(out, db + one_index, mlen);
    *out_len = mlen;
    OPENSSL_free(db);
    return 1;
  }

decoding_err:
  // To avoid chosen ciphertext attacks, the error message should not reveal
  // which kind of decoding error happened.
  OPENSSL_PUT_ERROR(RSA, RSA_R_OAEP_DECODING_ERROR);
err:
  OPENSSL_free(db);
  return 0;
}